

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile(DeepTiledOutputFile *this)

{
  pthread_mutex_t *__mutex;
  OStream *pOVar1;
  OutputStreamMutex *pOVar2;
  Data *this_00;
  int iVar3;
  undefined4 extraout_var;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepTiledOutputFile_003d7528;
  if (this->_data != (Data *)0x0) {
    __mutex = (pthread_mutex_t *)this->_data->_streamData;
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    iVar3 = (*this->_data->_streamData->os->_vptr_OStream[3])();
    if (this->_data->tileOffsetsPosition != 0) {
      (*this->_data->_streamData->os->_vptr_OStream[4])();
      TileOffsets::writeTo(&this->_data->tileOffsets,this->_data->_streamData->os);
      pOVar1 = this->_data->_streamData->os;
      (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar3));
    }
    pthread_mutex_unlock(__mutex);
    if (((this->_data->_deleteStream == true) &&
        (pOVar2 = this->_data->_streamData, pOVar2 != (OutputStreamMutex *)0x0)) &&
       (pOVar1 = pOVar2->os, pOVar1 != (OStream *)0x0)) {
      (*pOVar1->_vptr_OStream[1])();
    }
    if ((this->_data->partNumber == -1) &&
       (pOVar2 = this->_data->_streamData, pOVar2 != (OutputStreamMutex *)0x0)) {
      operator_delete(pOVar2,0x38);
    }
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) {
      Data::~Data(this_00);
      operator_delete(this_00,0x1d0);
    }
  }
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

DeepTiledOutputFile::~DeepTiledOutputFile ()
{
    if (_data)
    {
        {
#if ILMTHREAD_THREADING_ENABLED
            std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
            uint64_t originalPosition = _data->_streamData->os->tellp ();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _data->_streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_data->_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _data->_streamData->os->seekp (originalPosition);
                }
                catch (
                    ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_data->_deleteStream && _data->_streamData)
            delete _data->_streamData->os;

        //
        // (TODO) we should have a way to tell if the stream data is owned by
        // this file or by a parent multipart file.
        //

        if (_data->partNumber == -1 && _data->_streamData)
            delete _data->_streamData;

        delete _data;
    }
}